

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void ncnn::copy_cut_border(Mat *src,Mat *dst,int top,int bottom,int left,int right)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  int q;
  int iVar7;
  ulong uVar8;
  int iVar9;
  size_t sVar10;
  long lVar11;
  undefined1 auVar12 [16];
  Mat local_90;
  Mat local_60;
  
  if (right + left == 0 && bottom + top == 0) {
    if (dst != src) {
      piVar2 = src->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = dst->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (dst->data != (void *)0x0)) {
          free(*(void **)((long)dst->data + -8));
        }
      }
      dst->h = 0;
      dst->c = 0;
      dst->cstep = 0;
      dst->elemsize = 0;
      dst->dims = 0;
      dst->w = 0;
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      piVar2 = src->refcount;
      dst->data = src->data;
      dst->refcount = piVar2;
      dst->elemsize = src->elemsize;
      iVar7 = src->w;
      iVar9 = src->h;
      iVar3 = src->c;
      dst->dims = src->dims;
      dst->w = iVar7;
      dst->h = iVar9;
      dst->c = iVar3;
      dst->cstep = src->cstep;
    }
  }
  else {
    iVar9 = src->w - (right + left);
    iVar7 = src->h - (bottom + top);
    if (src->dims == 3) {
      uVar1 = src->c;
      auVar12._0_4_ = -(uint)(dst->dims == 3);
      auVar12._4_4_ = -(uint)(iVar9 == dst->w);
      auVar12._8_4_ = -(uint)(iVar7 == dst->h);
      auVar12._12_4_ = -(uint)(uVar1 == dst->c);
      iVar3 = movmskps(3,auVar12);
      if ((iVar3 == 0xf) && (dst->elemsize == 4)) {
        if (dst->data == (void *)0x0) {
          return;
        }
        sVar10 = dst->cstep;
        uVar4 = uVar1;
      }
      else {
        piVar2 = dst->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) && (dst->data != (void *)0x0)) {
            free(*(void **)((long)dst->data + -8));
          }
        }
        dst->data = (void *)0x0;
        dst->refcount = (int *)0x0;
        dst->elemsize = 4;
        dst->dims = 3;
        dst->w = iVar9;
        dst->h = iVar7;
        dst->c = uVar1;
        sVar10 = (long)(iVar7 * iVar9) + 3U & 0x3ffffffffffffffc;
        dst->cstep = sVar10;
        lVar11 = (long)(int)uVar1 * sVar10;
        if (lVar11 == 0) {
          return;
        }
        pvVar5 = malloc(lVar11 * 4 + 0x1c);
        pvVar6 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar6 - 8) = pvVar5;
        dst->data = pvVar6;
        piVar2 = (int *)((long)pvVar6 + lVar11 * 4);
        dst->refcount = piVar2;
        *piVar2 = 1;
        uVar4 = dst->c;
      }
      if (0 < (int)uVar1 && (long)(int)uVar4 * sVar10 != 0) {
        uVar8 = 0;
        do {
          local_60.w = src->w;
          local_60.h = src->h;
          local_60.elemsize = src->elemsize;
          local_60.data = (void *)(src->cstep * uVar8 * local_60.elemsize + (long)src->data);
          local_60.refcount = (int *)0x0;
          local_60.dims = 2;
          local_60.c = 1;
          local_60.cstep = (size_t)(local_60.h * local_60.w);
          local_90.w = dst->w;
          local_90.h = dst->h;
          local_90.elemsize = dst->elemsize;
          local_90.data = (void *)(dst->cstep * uVar8 * local_90.elemsize + (long)dst->data);
          local_90.refcount = (int *)0x0;
          local_90.dims = 2;
          local_90.c = 1;
          local_90.cstep = (size_t)(local_90.h * local_90.w);
          copy_cut_border_image(&local_60,&local_90,top,left);
          uVar8 = uVar8 + 1;
        } while (uVar1 != uVar8);
      }
    }
    else if (src->dims == 2) {
      if ((((dst->dims == 2) && (dst->w == iVar9)) && (dst->h == iVar7)) && (dst->elemsize == 4)) {
        if (dst->data == (void *)0x0) {
          return;
        }
        sVar10 = dst->cstep;
      }
      else {
        piVar2 = dst->refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if ((*piVar2 == 0) && (dst->data != (void *)0x0)) {
            free(*(void **)((long)dst->data + -8));
          }
        }
        dst->data = (void *)0x0;
        dst->refcount = (int *)0x0;
        dst->elemsize = 4;
        dst->dims = 2;
        dst->w = iVar9;
        dst->h = iVar7;
        dst->c = 1;
        sVar10 = (size_t)(iVar7 * iVar9);
        dst->cstep = sVar10;
        if (iVar7 * iVar9 == 0) {
          return;
        }
        pvVar5 = malloc(sVar10 * 4 + 0x1c);
        pvVar6 = (void *)((long)pvVar5 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar6 - 8) = pvVar5;
        dst->data = pvVar6;
        piVar2 = (int *)((long)pvVar6 + sVar10 * 4);
        dst->refcount = piVar2;
        *piVar2 = 1;
      }
      if ((long)dst->c * sVar10 != 0) {
        copy_cut_border_image(src,dst,top,left);
        return;
      }
    }
  }
  return;
}

Assistant:

void copy_cut_border(const Mat& src, Mat& dst, int top, int bottom, int left, int right)
{
    int w = src.w - left - right;
    int h = src.h - top - bottom;

    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h);
        if (dst.empty())
            return;

        copy_cut_border_image(src, dst, top, left);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat cutm = dst.channel(q);

            copy_cut_border_image(m, cutm, top, left);
        }
    }
}